

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_inst.c
# Opt level: O0

void brTable_op(vm *v,instruction *inst)

{
  labelIndex *plVar1;
  uint64 uVar2;
  labelIndex local_34;
  labelIndex l_index;
  uint64 t_index;
  brTableArgs *bta;
  stack *s;
  instruction *inst_local;
  vm *v_local;
  
  plVar1 = (labelIndex *)inst->arg;
  uVar2 = popU64(&v->operandStack);
  local_34 = *plVar1;
  if (uVar2 < plVar1[1]) {
    local_34 = *(labelIndex *)(*(long *)(plVar1 + 2) + uVar2 * 4);
  }
  br(v,local_34);
  return;
}

Assistant:

void brTable_op(vm *v, instruction *inst) {
    stack *s = &v->operandStack;
    brTableArgs *bta = (brTableArgs *) inst->arg;
    uint64 t_index = popU64(s);
    labelIndex l_index = bta->defaultLabels;
    if (t_index < bta->labelCount)
        l_index = *(bta->labels + t_index);
    br(v, l_index);
}